

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ArenaImpl::Init(ArenaImpl *this)

{
  __pointer_type pSVar1;
  Block *pBVar2;
  size_t sVar3;
  long lVar4;
  long *in_FS_OFFSET;
  
  LOCK();
  UNLOCK();
  lVar4 = lifecycle_id_generator_ + 1;
  this->lifecycle_id_ = lifecycle_id_generator_;
  lifecycle_id_generator_ = lVar4;
  (this->hint_)._M_b._M_p = (__pointer_type)0x0;
  (this->threads_)._M_b._M_p = (__pointer_type)0x0;
  pBVar2 = this->initial_block_;
  if (pBVar2 != (Block *)0x0) {
    sVar3 = (this->options_).initial_block_size;
    pBVar2->next_ = (Block *)0x0;
    pBVar2->size_ = sVar3;
    lVar4 = *in_FS_OFFSET;
    pSVar1 = (__pointer_type)(pBVar2 + 1);
    pBVar2->pos_ = 0x60;
    pBVar2[1].next_ = (Block *)this;
    pBVar2[1].pos_ = lVar4 - 0x10;
    pBVar2[1].size_ = (size_t)pBVar2;
    pBVar2[2].size_ = (size_t)(pBVar2 + 4);
    pBVar2[3].next_ = (Block *)((long)&pBVar2->next_ + sVar3);
    pBVar2[3].pos_ = 0;
    pBVar2[3].size_ = 0;
    pBVar2[2].next_ = (Block *)0x0;
    pBVar2[2].pos_ = 0;
    (this->threads_)._M_b._M_p = pSVar1;
    (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (this->options_).initial_block_size;
    in_FS_OFFSET[-1] = (long)pSVar1;
    in_FS_OFFSET[-2] = this->lifecycle_id_;
    (this->hint_)._M_b._M_p = pSVar1;
    return;
  }
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

void ArenaImpl::Init() {
  lifecycle_id_ =
      lifecycle_id_generator_.fetch_add(1, std::memory_order_relaxed);
  hint_.store(nullptr, std::memory_order_relaxed);
  threads_.store(nullptr, std::memory_order_relaxed);

  if (initial_block_) {
    // Thread which calls Init() owns the first block. This allows the
    // single-threaded case to allocate on the first block without having to
    // perform atomic operations.
    new (initial_block_) Block(options_.initial_block_size, NULL);
    SerialArena* serial =
        SerialArena::New(initial_block_, &thread_cache(), this);
    serial->set_next(NULL);
    threads_.store(serial, std::memory_order_relaxed);
    space_allocated_.store(options_.initial_block_size,
                           std::memory_order_relaxed);
    CacheSerialArena(serial);
  } else {
    space_allocated_.store(0, std::memory_order_relaxed);
  }
}